

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

ConstantLegal kratos::Const::is_legal(int64_t value,uint32_t width,bool is_signed)

{
  undefined7 in_register_00000011;
  ulong uVar1;
  
  if ((int)CONCAT71(in_register_00000011,is_signed) == 0) {
    if ((ulong)value >> ((byte)width & 0x3f) != 0 && width != 0x40) {
      return Big;
    }
  }
  else {
    uVar1 = -1L << ((byte)width - 1 & 0x3f);
    if ((long)~uVar1 < value || value < (long)uVar1) {
      return Big - (value < (long)uVar1);
    }
  }
  return Legal;
}

Assistant:

Const::ConstantLegal Const::is_legal(int64_t value, uint32_t width, bool is_signed) {
    if (is_signed) {
        // compute the -max value
        uint64_t temp = (~0ull) << (width - 1);
        int64_t min = 0;
        std::memcpy(&min, &temp, sizeof(min));
        if (value < min) return Const::ConstantLegal::Small;
        temp = (1ull << (width - 1)) - 1;
        int64_t max;
        std::memcpy(&max, &temp, sizeof(max));
        if (value > max) return Const::ConstantLegal::Big;
    } else {
        uint64_t max = width == 64 ? std::numeric_limits<uint64_t>::max() : (1ull << width) - 1;
        uint64_t unsigned_value;
        std::memcpy(&unsigned_value, &value, sizeof(unsigned_value));
        if (unsigned_value > max) return Const::ConstantLegal::Big;
    }
    return Const::ConstantLegal::Legal;
}